

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O3

void __thiscall deqp::egl::GLES2ThreadTest::MakeCurrent::exec(MakeCurrent *this,Thread *t)

{
  deInt32 *pdVar1;
  int *piVar2;
  ostream *poVar3;
  SharedPtrStateBase *pSVar4;
  long *plVar5;
  _func_int **pp_Var6;
  EGLSurface pvVar7;
  deUint32 dVar8;
  Thread *pTVar9;
  GLES2Context *pGVar10;
  SharedPtrStateBase *pSVar11;
  undefined1 local_1b0 [136];
  ios_base local_128 [264];
  
  pTVar9 = (Thread *)__dynamic_cast(t,&tcu::ThreadUtil::Thread::typeinfo,&EGLThread::typeinfo,0);
  if (pTVar9 != (Thread *)0x0) {
    pGVar10 = (this->m_context).m_ptr;
    local_1b0._0_8_ = pTVar9;
    if (pGVar10 == (GLES2Context *)0x0) {
      pSVar4 = *(SharedPtrStateBase **)&pTVar9[1].m_random.m_rnd.z;
      pSVar11 = (this->m_context).m_state;
      if (pSVar4 != pSVar11) {
        if (pSVar4 == (SharedPtrStateBase *)0x0) {
          pGVar10 = (GLES2Context *)0x0;
        }
        else {
          LOCK();
          pdVar1 = &pSVar4->strongRefCount;
          *pdVar1 = *pdVar1 + -1;
          UNLOCK();
          if (*pdVar1 == 0) {
            pTVar9[1].m_random.m_rnd.x = 0;
            pTVar9[1].m_random.m_rnd.y = 0;
            (**(code **)(**(long **)&pTVar9[1].m_random.m_rnd.z + 0x10))();
          }
          LOCK();
          piVar2 = (int *)(*(long *)&pTVar9[1].m_random.m_rnd.z + 0xc);
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            plVar5 = *(long **)&pTVar9[1].m_random.m_rnd.z;
            if (plVar5 != (long *)0x0) {
              (**(code **)(*plVar5 + 8))();
            }
            pTVar9[1].m_random.m_rnd.z = 0;
            pTVar9[1].m_random.m_rnd.w = 0;
          }
          pGVar10 = (this->m_context).m_ptr;
          pSVar11 = (this->m_context).m_state;
        }
        *(GLES2Context **)&pTVar9[1].m_random.m_rnd = pGVar10;
        *(SharedPtrStateBase **)&pTVar9[1].m_random.m_rnd.z = pSVar11;
        if (pSVar11 != (SharedPtrStateBase *)0x0) {
          LOCK();
          pSVar11->strongRefCount = pSVar11->strongRefCount + 1;
          UNLOCK();
          LOCK();
          piVar2 = (int *)(*(long *)&pTVar9[1].m_random.m_rnd.z + 0xc);
          *piVar2 = *piVar2 + 1;
          UNLOCK();
        }
      }
      std::__cxx11::stringstream::stringstream((stringstream *)(local_1b0 + 8));
      poVar3 = (ostream *)(local_1b0 + 0x18);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Begin -- eglMakeCurrent(",0x18);
      std::ostream::_M_insert<void_const*>(poVar3);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,", EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT)",0x31);
      tcu::ThreadUtil::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndToken *)&tcu::ThreadUtil::Message::End);
      std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b0 + 8));
      std::ios_base::~ios_base(local_128);
      pp_Var6 = pTVar9[1].super_Thread._vptr_Thread;
      (**(code **)(*pp_Var6 + 0x138))(pp_Var6,this->m_display,0,0,0);
      dVar8 = (**(code **)(*pTVar9[1].super_Thread._vptr_Thread + 0xf8))();
      eglu::checkError(dVar8,
                       "makeCurrent(m_display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                       ,0x2d1);
      local_1b0._0_8_ = pTVar9;
      std::__cxx11::stringstream::stringstream((stringstream *)(local_1b0 + 8));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1b0 + 0x18),"End -- eglMakeCurrent()",0x17);
      tcu::ThreadUtil::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndToken *)&tcu::ThreadUtil::Message::End);
    }
    else {
      pTVar9[1].m_messageLock.m_mutex = (deMutex)((this->m_surface).m_ptr)->surface;
      pSVar4 = *(SharedPtrStateBase **)&pTVar9[1].m_random.m_rnd.z;
      pSVar11 = (this->m_context).m_state;
      if (pSVar4 != pSVar11) {
        if (pSVar4 != (SharedPtrStateBase *)0x0) {
          LOCK();
          pdVar1 = &pSVar4->strongRefCount;
          *pdVar1 = *pdVar1 + -1;
          UNLOCK();
          if (*pdVar1 == 0) {
            pTVar9[1].m_random.m_rnd.x = 0;
            pTVar9[1].m_random.m_rnd.y = 0;
            (**(code **)(**(long **)&pTVar9[1].m_random.m_rnd.z + 0x10))();
          }
          LOCK();
          piVar2 = (int *)(*(long *)&pTVar9[1].m_random.m_rnd.z + 0xc);
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            plVar5 = *(long **)&pTVar9[1].m_random.m_rnd.z;
            if (plVar5 != (long *)0x0) {
              (**(code **)(*plVar5 + 8))();
            }
            pTVar9[1].m_random.m_rnd.z = 0;
            pTVar9[1].m_random.m_rnd.w = 0;
          }
          pGVar10 = (this->m_context).m_ptr;
          pSVar11 = (this->m_context).m_state;
        }
        *(GLES2Context **)&pTVar9[1].m_random.m_rnd = pGVar10;
        *(SharedPtrStateBase **)&pTVar9[1].m_random.m_rnd.z = pSVar11;
        if (pSVar11 != (SharedPtrStateBase *)0x0) {
          LOCK();
          pSVar11->strongRefCount = pSVar11->strongRefCount + 1;
          UNLOCK();
          LOCK();
          piVar2 = (int *)(*(long *)&pTVar9[1].m_random.m_rnd.z + 0xc);
          *piVar2 = *piVar2 + 1;
          UNLOCK();
        }
      }
      std::__cxx11::stringstream::stringstream((stringstream *)(local_1b0 + 8));
      poVar3 = (ostream *)(local_1b0 + 0x18);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Begin -- eglMakeCurrent(",0x18);
      std::ostream::_M_insert<void_const*>(poVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
      std::ostream::_M_insert<void_const*>(poVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
      std::ostream::_M_insert<void_const*>(poVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
      std::ostream::_M_insert<void_const*>(poVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
      tcu::ThreadUtil::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndToken *)&tcu::ThreadUtil::Message::End);
      std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b0 + 8));
      std::ios_base::~ios_base(local_128);
      pp_Var6 = pTVar9[1].super_Thread._vptr_Thread;
      pvVar7 = ((this->m_surface).m_ptr)->surface;
      (**(code **)(*pp_Var6 + 0x138))
                (pp_Var6,this->m_display,pvVar7,pvVar7,((this->m_context).m_ptr)->context);
      dVar8 = (**(code **)(*pTVar9[1].super_Thread._vptr_Thread + 0xf8))();
      eglu::checkError(dVar8,
                       "makeCurrent(m_display, m_surface->surface, m_surface->surface, m_context->context)"
                       ,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                       ,0x2c9);
      local_1b0._0_8_ = pTVar9;
      std::__cxx11::stringstream::stringstream((stringstream *)(local_1b0 + 8));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1b0 + 0x18),"End -- eglMakeCurrent()",0x17);
      tcu::ThreadUtil::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndToken *)&tcu::ThreadUtil::Message::End);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b0 + 8));
    std::ios_base::~ios_base(local_128);
    return;
  }
  __cxa_bad_cast();
}

Assistant:

void MakeCurrent::exec (tcu::ThreadUtil::Thread& t)
{
	EGLThread& thread = dynamic_cast<EGLThread&>(t);

	if (m_context)
	{
		thread.eglSurface = m_surface->surface;
		thread.runtimeContext = m_context;

		DE_ASSERT(m_surface);
		thread.newMessage() << "Begin -- eglMakeCurrent(" << m_display << ", " << m_surface->surface << ", " << m_surface->surface << ", " << m_context->context << ")" << tcu::ThreadUtil::Message::End;
		EGLU_CHECK_CALL(thread.egl, makeCurrent(m_display, m_surface->surface, m_surface->surface, m_context->context));
		thread.newMessage() << "End -- eglMakeCurrent()" << tcu::ThreadUtil::Message::End;
	}
	else
	{
		thread.runtimeContext = m_context;

		thread.newMessage() << "Begin -- eglMakeCurrent(" << m_display << ", EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT)" << tcu::ThreadUtil::Message::End;
		EGLU_CHECK_CALL(thread.egl, makeCurrent(m_display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT));
		thread.newMessage() << "End -- eglMakeCurrent()" << tcu::ThreadUtil::Message::End;
	}
}